

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toeplitz_plus_hankel_system_solver.h
# Opt level: O1

void __thiscall sptk::ToeplitzPlusHankelSystemSolver::Buffer::Buffer(Buffer *this)

{
  value_type_conflict *__val;
  pointer pdVar1;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_0011f2b8;
  (this->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->r_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->prev_x_).super__Vector_base<sptk::Matrix2D,_std::allocator<sptk::Matrix2D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->p_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->p_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->p_).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar1 = (pointer)operator_new(0x10);
  (this->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar1;
  (this->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1;
  (this->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pdVar1 + 2;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  (this->ep_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1 + 2;
  (this->g_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->g_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->g_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar1 = (pointer)operator_new(0x10);
  (this->g_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar1;
  (this->g_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1;
  (this->g_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pdVar1 + 2;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  (this->g_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1 + 2;
  (this->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pdVar1 = (pointer)operator_new(0x10);
  (this->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar1;
  (this->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1;
  (this->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pdVar1 + 2;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  (this->bar_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = pdVar1 + 2;
  (this->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pdVar1 = (pointer)operator_new(0x10);
  (this->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = pdVar1;
  (this->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar1;
  (this->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pdVar1 + 2;
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  (this->tmp_vector_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = pdVar1 + 2;
  Matrix2D::Matrix2D(&this->vx_);
  Matrix2D::Matrix2D(&this->ex_);
  Matrix2D::Matrix2D(&this->bx_);
  Matrix2D::Matrix2D(&this->inv_);
  Matrix2D::Matrix2D(&this->tau_);
  Matrix2D::Matrix2D(&this->tmp_matrix_);
  return;
}

Assistant:

Buffer() : ep_(2), g_(2), bar_(2), tmp_vector_(2) {
    }